

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_1::SyncObjectResetCase::waitForReset
          (SyncObjectResetCase *this,
          SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *contextReset)

{
  ContextReset *pCVar1;
  GLenum err;
  GLsync p_Var2;
  
  pCVar1 = contextReset->m_ptr;
  p_Var2 = (*pCVar1->m_gl->fenceSync)(0x9117,0);
  pCVar1->m_sync = p_Var2;
  err = (*pCVar1->m_gl->getError)();
  glu::checkError(err,"glFenceSync()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x27f);
  (*contextReset->m_ptr->_vptr_ContextReset[4])();
  ContextReset::finish(contextReset->m_ptr);
  return;
}

Assistant:

virtual void waitForReset (de::SharedPtr<ContextReset>& contextReset)
	{
		contextReset->createSyncObject();
		contextReset->teardown();
		contextReset->finish();
	}